

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void __thiscall DFlicker::DFlicker(DFlicker *this,sector_t *sector,int upper,int lower)

{
  int iVar1;
  uint uVar2;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00871698;
  if (0x7ffe < upper) {
    upper = 0x7fff;
  }
  if (upper < -0x7fff) {
    upper = -0x8000;
  }
  this->m_MaxLight = upper;
  iVar1 = 0x7fff;
  if (lower < 0x7fff) {
    iVar1 = lower;
  }
  if (iVar1 < -0x7fff) {
    iVar1 = -0x8000;
  }
  this->m_MinLight = iVar1;
  sector->lightlevel = (short)upper;
  uVar2 = FRandom::GenRand32(&pr_flicker);
  this->m_Count = (uVar2 & 0x40) + 1;
  return;
}

Assistant:

DFlicker::DFlicker (sector_t *sector, int upper, int lower)
	: DLighting (sector)
{
	m_MaxLight = sector_t::ClampLight(upper);
	m_MinLight = sector_t::ClampLight(lower);
	sector->lightlevel = m_MaxLight;
	m_Count = (pr_flicker()&64)+1;
}